

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler.cpp
# Opt level: O1

cubeb_resampler *
cubeb_resampler_create
          (cubeb_stream *stream,cubeb_stream_params *input_params,cubeb_stream_params *output_params
          ,uint target_rate,cubeb_data_callback callback,void *user_ptr,
          cubeb_resampler_quality quality,cubeb_resampler_reclock reclock)

{
  uint32_t uVar1;
  delay_line<float> *pdVar2;
  cubeb_data_callback p_Var3;
  int iVar4;
  uint32_t uVar5;
  cubeb_stream_params *pcVar6;
  cubeb_resampler *pcVar7;
  passthrough_resampler<float> *this;
  cubeb_resampler_speex_one_way<float> *this_00;
  cubeb_resampler_speex_one_way<float> *this_01;
  delay_line<float> *pdVar8;
  code *pcVar9;
  uint32_t uVar10;
  bool bVar11;
  bool bVar12;
  delay_line<float> *pdStackY_58;
  delay_line<float> *pdStackY_50;
  cubeb_data_callback p_StackY_48;
  cubeb_stream *pcStackY_40;
  void *pvStackY_38;
  
  pcVar6 = input_params;
  if (input_params == (cubeb_stream_params *)0x0) {
    pcVar6 = output_params;
  }
  if (pcVar6->format != CUBEB_SAMPLE_FLOAT32LE) {
    if (pcVar6->format != CUBEB_SAMPLE_S16LE) {
      return (cubeb_resampler *)0x0;
    }
    pcVar7 = cubeb_resampler_create_internal<short>
                       (stream,input_params,output_params,target_rate,callback,user_ptr,quality,
                        reclock);
    return pcVar7;
  }
  pdStackY_50 = (delay_line<float> *)0x0;
  pdStackY_58 = (delay_line<float> *)0x0;
  if (((((input_params == (cubeb_stream_params *)0x0) ||
        (output_params == (cubeb_stream_params *)0x0)) || (input_params->rate != target_rate)) ||
      (output_params->rate != target_rate)) &&
     (((output_params != (cubeb_stream_params *)0x0 || input_params == (cubeb_stream_params *)0x0 ||
       (input_params->rate != target_rate)) &&
      ((output_params == (cubeb_stream_params *)0x0 || input_params != (cubeb_stream_params *)0x0 ||
       (output_params->rate != target_rate)))))) {
    pcStackY_40 = stream;
    pvStackY_38 = user_ptr;
    if ((output_params == (cubeb_stream_params *)0x0) ||
       (uVar10 = output_params->rate, uVar10 == target_rate)) {
      this_00 = (cubeb_resampler_speex_one_way<float> *)0x0;
    }
    else {
      this_00 = (cubeb_resampler_speex_one_way<float> *)operator_new(0x58);
      iVar4 = -1;
      if (quality < (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT)) {
        iVar4 = quality + (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT);
      }
      cubeb_resampler_speex_one_way<float>::cubeb_resampler_speex_one_way
                (this_00,output_params->channels,target_rate,uVar10,iVar4);
    }
    p_StackY_48 = callback;
    if (input_params == (cubeb_stream_params *)0x0) {
      this_01 = (cubeb_resampler_speex_one_way<float> *)0x0;
    }
    else {
      uVar10 = input_params->rate;
      if (uVar10 == target_rate) {
        this_01 = (cubeb_resampler_speex_one_way<float> *)0x0;
      }
      else {
        this_01 = (cubeb_resampler_speex_one_way<float> *)operator_new(0x58);
        iVar4 = -1;
        if (quality < (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT)) {
          iVar4 = quality + (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT);
        }
        cubeb_resampler_speex_one_way<float>::cubeb_resampler_speex_one_way
                  (this_01,input_params->channels,uVar10,target_rate,iVar4);
      }
    }
    if ((((this_01 == (cubeb_resampler_speex_one_way<float> *)0x0) ||
         (output_params == (cubeb_stream_params *)0x0)) ||
        (input_params == (cubeb_stream_params *)0x0)) ||
       (this_00 != (cubeb_resampler_speex_one_way<float> *)0x0)) {
      if (((this_00 != (cubeb_resampler_speex_one_way<float> *)0x0) &&
          (output_params != (cubeb_stream_params *)0x0)) &&
         ((input_params != (cubeb_stream_params *)0x0 &&
          (this_01 == (cubeb_resampler_speex_one_way<float> *)0x0)))) {
        pdVar8 = (delay_line<float> *)operator_new(0x48);
        iVar4 = speex_resampler_get_output_latency(this_00->speex_resampler);
        uVar5 = iVar4 + this_00->additional_latency;
        uVar10 = input_params->channels;
        uVar1 = output_params->rate;
        (pdVar8->super_processor).channels = uVar10;
        pdVar8->length = uVar5;
        pdVar8->leftover_samples = 0;
        (pdVar8->delay_output_buffer).capacity_ = 0;
        (pdVar8->delay_output_buffer).length_ = 0;
        (pdVar8->delay_input_buffer).length_ = 0;
        (pdVar8->delay_output_buffer).data_ = (float *)0x0;
        (pdVar8->delay_input_buffer).data_ = (float *)0x0;
        (pdVar8->delay_input_buffer).capacity_ = 0;
        pdVar8->sample_rate = uVar1;
        auto_array<float>::push_silence(&pdVar8->delay_input_buffer,(ulong)(uVar10 * uVar5));
        pdVar2 = pdStackY_50;
        bVar11 = pdStackY_50 != (delay_line<float> *)0x0;
        pdStackY_50 = pdVar8;
        if (bVar11) {
          std::default_delete<delay_line<float>_>::operator()
                    ((default_delete<delay_line<float>_> *)&pdStackY_50,pdVar2);
          pdVar8 = pdStackY_50;
        }
        goto LAB_0010ffb5;
      }
    }
    else {
      pdVar8 = (delay_line<float> *)operator_new(0x48);
      iVar4 = speex_resampler_get_output_latency(this_01->speex_resampler);
      uVar5 = iVar4 + this_01->additional_latency;
      uVar10 = output_params->rate;
      uVar1 = output_params->channels;
      (pdVar8->super_processor).channels = uVar1;
      pdVar8->length = uVar5;
      pdVar8->leftover_samples = 0;
      (pdVar8->delay_output_buffer).capacity_ = 0;
      (pdVar8->delay_output_buffer).length_ = 0;
      (pdVar8->delay_input_buffer).length_ = 0;
      (pdVar8->delay_output_buffer).data_ = (float *)0x0;
      (pdVar8->delay_input_buffer).data_ = (float *)0x0;
      (pdVar8->delay_input_buffer).capacity_ = 0;
      pdVar8->sample_rate = uVar10;
      auto_array<float>::push_silence(&pdVar8->delay_input_buffer,(ulong)(uVar1 * uVar5));
      pdVar2 = pdStackY_58;
      bVar11 = pdStackY_58 != (delay_line<float> *)0x0;
      pdStackY_58 = pdVar8;
      if (bVar11) {
        std::default_delete<delay_line<float>_>::operator()
                  ((default_delete<delay_line<float>_> *)&pdStackY_58,pdVar2);
        pdVar8 = pdStackY_58;
      }
LAB_0010ffb5:
      if (pdVar8 == (delay_line<float> *)0x0) {
        this = (passthrough_resampler<float> *)0x0;
        goto LAB_0011006e;
      }
    }
    p_Var3 = p_StackY_48;
    bVar12 = g_cubeb_log_callback != (cubeb_log_callback)0x0;
    bVar11 = 0 < (int)g_cubeb_log_level;
    if (this_00 != (cubeb_resampler_speex_one_way<float> *)0x0 &&
        this_01 != (cubeb_resampler_speex_one_way<float> *)0x0) {
      if (bVar11 && bVar12) {
        (*g_cubeb_log_callback)
                  ("%s:%d: Resampling input (%d) and output (%d) to target rate of %dHz\n",
                   "cubeb_resampler_internal.h",0x236,(ulong)input_params->rate,
                   (ulong)output_params->rate,target_rate);
      }
      this = (passthrough_resampler<float> *)operator_new(0x48);
      (this->super_cubeb_resampler)._vptr_cubeb_resampler = (_func_int **)&PTR_fill_001491a8;
      *(cubeb_resampler_speex_one_way<float> **)&this->super_processor = this_01;
      this->stream = (cubeb_stream *)this_00;
      (this->internal_input_buffer).data_ = (float *)pcStackY_40;
      (this->internal_input_buffer).capacity_ = (size_t)p_Var3;
      (this->internal_input_buffer).length_ = (size_t)pvStackY_38;
      *(undefined1 *)&this->sample_rate = 0;
      this->data_callback =
           cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_cubeb_resampler_speex_one_way<float>_>
           ::fill_internal_duplex;
      this->user_ptr = (void *)0x0;
      goto LAB_00110069;
    }
    if (this_01 != (cubeb_resampler_speex_one_way<float> *)0x0) {
      if (bVar11 && bVar12) {
        (*g_cubeb_log_callback)
                  ("%s:%d: Resampling input (%d) to target and output rate of %dHz\n",
                   "cubeb_resampler_internal.h",0x23d,(ulong)input_params->rate,target_rate);
      }
      this = (passthrough_resampler<float> *)operator_new(0x48);
      pdVar8 = pdStackY_58;
      pdStackY_58 = (delay_line<float> *)0x0;
      (this->super_cubeb_resampler)._vptr_cubeb_resampler = (_func_int **)&PTR_fill_001491d8;
      *(cubeb_resampler_speex_one_way<float> **)&this->super_processor = this_01;
      this->stream = (cubeb_stream *)pdVar8;
      (this->internal_input_buffer).data_ = (float *)pcStackY_40;
      (this->internal_input_buffer).capacity_ = (size_t)p_Var3;
      (this->internal_input_buffer).length_ = (size_t)pvStackY_38;
      *(undefined1 *)&this->sample_rate = 0;
      if (pdVar8 == (delay_line<float> *)0x0) {
        pcVar9 = cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_delay_line<float>_>
                 ::fill_internal_input;
      }
      else {
        pcVar9 = cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_delay_line<float>_>
                 ::fill_internal_duplex;
      }
      this->data_callback = pcVar9;
      this->user_ptr = (void *)0x0;
      this_01 = (cubeb_resampler_speex_one_way<float> *)0x0;
      goto LAB_0011006e;
    }
    if (bVar11 && bVar12) {
      (*g_cubeb_log_callback)
                ("%s:%d: Resampling output (%dHz) to target and input rate of %dHz\n",
                 "cubeb_resampler_internal.h",0x244,(ulong)output_params->rate,target_rate);
    }
    this = (passthrough_resampler<float> *)operator_new(0x48);
    pdVar8 = pdStackY_50;
    pdStackY_50 = (delay_line<float> *)0x0;
    (this->super_cubeb_resampler)._vptr_cubeb_resampler = (_func_int **)&PTR_fill_00149208;
    *(delay_line<float> **)&this->super_processor = pdVar8;
    this->stream = (cubeb_stream *)this_00;
    (this->internal_input_buffer).data_ = (float *)pcStackY_40;
    (this->internal_input_buffer).capacity_ = (size_t)p_Var3;
    (this->internal_input_buffer).length_ = (size_t)pvStackY_38;
    *(undefined1 *)&this->sample_rate = 0;
    if (this_00 == (cubeb_resampler_speex_one_way<float> *)0x0 || pdVar8 == (delay_line<float> *)0x0
       ) {
      if (pdVar8 != (delay_line<float> *)0x0) {
        pcVar9 = cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>
                 ::fill_internal_input;
        goto LAB_0011020e;
      }
      if (this_00 != (cubeb_resampler_speex_one_way<float> *)0x0) {
        pcVar9 = cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>
                 ::fill_internal_output;
        goto LAB_0011020e;
      }
    }
    else {
      pcVar9 = cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>
               ::fill_internal_duplex;
LAB_0011020e:
      this->data_callback = pcVar9;
      this->user_ptr = (void *)0x0;
    }
  }
  else {
    if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (0 < (int)g_cubeb_log_level)) {
      (*g_cubeb_log_callback)
                ("%s:%d: Input and output sample-rate match, target rate of %dHz\n",
                 "cubeb_resampler_internal.h",0x206,target_rate);
    }
    this = (passthrough_resampler<float> *)operator_new(0x48);
    if (input_params == (cubeb_stream_params *)0x0) {
      uVar10 = 0;
    }
    else {
      uVar10 = input_params->channels;
    }
    passthrough_resampler<float>::passthrough_resampler
              (this,stream,callback,user_ptr,uVar10,target_rate);
LAB_00110069:
    this_01 = (cubeb_resampler_speex_one_way<float> *)0x0;
  }
  this_00 = (cubeb_resampler_speex_one_way<float> *)0x0;
LAB_0011006e:
  if (pdStackY_58 != (delay_line<float> *)0x0) {
    std::default_delete<delay_line<float>_>::operator()
              ((default_delete<delay_line<float>_> *)&pdStackY_58,pdStackY_58);
  }
  if (pdStackY_50 != (delay_line<float> *)0x0) {
    std::default_delete<delay_line<float>_>::operator()
              ((default_delete<delay_line<float>_> *)&pdStackY_50,pdStackY_50);
  }
  if (this_00 != (cubeb_resampler_speex_one_way<float> *)0x0) {
    (*(code *)((cubeb *)this_00->_vptr_cubeb_resampler_speex_one_way)[1].ops)(this_00);
  }
  if (this_01 != (cubeb_resampler_speex_one_way<float> *)0x0) {
    (*this_01->_vptr_cubeb_resampler_speex_one_way[1])(this_01);
  }
  return &this->super_cubeb_resampler;
}

Assistant:

cubeb_resampler *
cubeb_resampler_create(cubeb_stream * stream,
                       cubeb_stream_params * input_params,
                       cubeb_stream_params * output_params,
                       unsigned int target_rate, cubeb_data_callback callback,
                       void * user_ptr, cubeb_resampler_quality quality,
                       cubeb_resampler_reclock reclock)
{
  cubeb_sample_format format;

  assert(input_params || output_params);

  if (input_params) {
    format = input_params->format;
  } else {
    format = output_params->format;
  }

  switch (format) {
  case CUBEB_SAMPLE_S16NE:
    return cubeb_resampler_create_internal<short>(
        stream, input_params, output_params, target_rate, callback, user_ptr,
        quality, reclock);
  case CUBEB_SAMPLE_FLOAT32NE:
    return cubeb_resampler_create_internal<float>(
        stream, input_params, output_params, target_rate, callback, user_ptr,
        quality, reclock);
  default:
    assert(false);
    return nullptr;
  }
}